

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

size_t aead_do_decrypt(ptls_aead_context_t *_ctx,void *output,void *input,size_t inlen,uint64_t seq,
                      void *aad,size_t aadlen)

{
  int iVar1;
  ptls_fusion_aesgcm_context_t *ppVar2;
  __m128i ctr;
  size_t enclen;
  aesgcm_context *ctx;
  void *aad_local;
  uint64_t seq_local;
  size_t inlen_local;
  void *input_local;
  void *output_local;
  ptls_aead_context_t *_ctx_local;
  
  if (inlen < 0x10) {
    _ctx_local = (ptls_aead_context_t *)0xffffffffffffffff;
  }
  else {
    _ctx_local = (ptls_aead_context_t *)(inlen - 0x10);
    if (_ctx[1].algo[4].setup_crypto <
        (_func_int_ptls_aead_context_t_ptr_int_void_ptr_void_ptr *)
        ((long)&_ctx_local->algo + aadlen)) {
      ppVar2 = ptls_fusion_aesgcm_set_capacity
                         ((ptls_fusion_aesgcm_context_t *)_ctx[1].algo,
                          (long)&_ctx_local->algo + aadlen);
      _ctx[1].algo = (st_ptls_aead_algorithm_t *)ppVar2;
    }
    ppVar2 = (ptls_fusion_aesgcm_context_t *)_ctx[1].algo;
    calc_counter((aesgcm_context *)_ctx,seq);
    ctr[1] = aadlen;
    ctr[0] = (longlong)aad;
    iVar1 = ptls_fusion_aesgcm_decrypt
                      (ppVar2,output,input,(size_t)_ctx_local,ctr,
                       (void *)((long)input + (long)_ctx_local),(size_t)ppVar2,output);
    if (iVar1 == 0) {
      _ctx_local = (ptls_aead_context_t *)0xffffffffffffffff;
    }
  }
  return (size_t)_ctx_local;
}

Assistant:

static size_t aead_do_decrypt(ptls_aead_context_t *_ctx, void *_output, const void *input, size_t inlen, uint64_t seq,
                              const void *aad, size_t aadlen)
{
    struct aead_crypto_context_t *ctx = (struct aead_crypto_context_t *)_ctx;
    uint8_t *output = _output, iv[PTLS_MAX_IV_SIZE];
    size_t off = 0, tag_size = ctx->super.algo->tag_size;
    int blocklen, ret;

    if (inlen < tag_size)
        return SIZE_MAX;

    ptls_aead__build_iv(ctx->super.algo, iv, ctx->static_iv, seq);
    ret = EVP_DecryptInit_ex(ctx->evp_ctx, NULL, NULL, NULL, iv);
    assert(ret);
    if (aadlen != 0) {
        ret = EVP_DecryptUpdate(ctx->evp_ctx, NULL, &blocklen, aad, (int)aadlen);
        assert(ret);
    }
    ret = EVP_DecryptUpdate(ctx->evp_ctx, output + off, &blocklen, input, (int)(inlen - tag_size));
    assert(ret);
    off += blocklen;
    if (!EVP_CIPHER_CTX_ctrl(ctx->evp_ctx, EVP_CTRL_GCM_SET_TAG, (int)tag_size, (void *)((uint8_t *)input + inlen - tag_size)))
        return SIZE_MAX;
    if (!EVP_DecryptFinal_ex(ctx->evp_ctx, output + off, &blocklen))
        return SIZE_MAX;
    off += blocklen;

    return off;
}